

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O3

void CPU::WDC65816::ProcessorStorageConstructor::direct
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  MicroOp local_1b [3];
  
  local_1b[0] = CycleFetchIncrementPC;
  if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*target->_M_invoker)((_Any_data *)target,local_1b);
    local_1b[1] = 0x23;
    if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*target->_M_invoker)((_Any_data *)target,local_1b + 1);
      local_1b[2] = 3;
      if ((target->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*target->_M_invoker)((_Any_data *)target,local_1b + 2);
        read_write(type,is8bit,target);
        return;
      }
    }
  }
  std::__throw_bad_function_call();
}

Assistant:

static void direct(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);			// DO.

		target(OperationConstructDirect);
		target(CycleFetchPreviousPCThrowaway);	// IO.

		read_write(type, is8bit, target);
	}